

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O1

ANNbool readPt(istream *in,int *p,int dim)

{
  ulong uVar1;
  long *plVar2;
  ulong uVar3;
  int *piVar4;
  bool bVar5;
  
  bVar5 = dim < 1;
  if (0 < dim) {
    plVar2 = (long *)std::istream::operator>>((istream *)in,p);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
      piVar4 = p + 1;
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if ((uint)dim == uVar3) break;
        plVar2 = (long *)std::istream::operator>>((istream *)in,piVar4);
        piVar4 = piVar4 + 1;
        uVar1 = uVar3 + 1;
      } while ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0);
      bVar5 = (uint)dim <= uVar3;
    }
  }
  return (ANNbool)bVar5;
}

Assistant:

ANNbool readPt(istream &in, int *p, int dim)  
{
    for (int i = 0; i < dim; i++) {
        if (!(in >> p[i])) return ANNfalse;
    }
    return ANNtrue;
}